

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

void iutest::detail::StringReplaceToLF(string *str)

{
  string *str_local;
  
  StringReplace(str,"\r\n",2,"\n");
  StringReplace(str,"\r",1,"\n");
  return;
}

Assistant:

inline void StringReplaceToLF(::std::string& str)
{
    StringReplace(str, "\r\n", 2, "\n");
    StringReplace(str, "\r"  , 1, "\n");
}